

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5MultiIterAdvanceRowid(Fts5Iter *pIter,int iChanged,Fts5SegIter **ppFirst)

{
  long lVar1;
  Fts5CResult *pFVar2;
  Fts5SegIter *pFVar3;
  uint uVar4;
  ulong uVar5;
  Fts5SegIter *pFVar6;
  i64 iVar7;
  uint uVar8;
  uint uVar9;
  
  pFVar3 = pIter->aSeg + (uint)iChanged;
  lVar1 = pIter->aSeg[(uint)iChanged].iRowid;
  if (lVar1 == pIter->iSwitchRowid) {
    uVar4 = pIter->bRev;
  }
  else {
    uVar4 = (uint)(lVar1 < pIter->iSwitchRowid);
    if (pIter->bRev != uVar4) goto LAB_001e034d;
  }
  uVar5 = (ulong)(iChanged ^ 1);
  iVar7 = -0x8000000000000000;
  if (uVar4 == 0) {
    iVar7 = 0x7fffffffffffffff;
  }
  pIter->iSwitchRowid = iVar7;
  pFVar2 = pIter->aFirst;
  uVar8 = iChanged + pIter->nSeg;
  while( true ) {
    uVar9 = (int)uVar8 / 2;
    if (pFVar2[(int)uVar9].bTermEq != '\0') {
      pFVar6 = pIter->aSeg + uVar5;
      lVar1 = pFVar6->iRowid;
      if (pFVar3->iRowid == lVar1) {
        return 1;
      }
      if ((uVar4 == pFVar3->iRowid < lVar1) || (pFVar6 = pFVar3, uVar4 == iVar7 < lVar1)) {
        pFVar3 = pFVar6;
        pIter->iSwitchRowid = lVar1;
        iVar7 = lVar1;
      }
    }
    pFVar2[(int)uVar9].iFirst = (u16)((uint)((int)pFVar3 - (int)pIter->aSeg) >> 7);
    if ((uVar8 & 0xfffffffe) == 2) break;
    uVar5 = (ulong)pFVar2[(int)(uVar9 ^ 1)].iFirst;
    uVar8 = uVar9;
  }
LAB_001e034d:
  *ppFirst = pFVar3;
  return 0;
}

Assistant:

static int fts5MultiIterAdvanceRowid(
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  Fts5SegIter **ppFirst
){
  Fts5SegIter *pNew = &pIter->aSeg[iChanged];

  if( pNew->iRowid==pIter->iSwitchRowid
   || (pNew->iRowid<pIter->iSwitchRowid)==pIter->bRev
  ){
    int i;
    Fts5SegIter *pOther = &pIter->aSeg[iChanged ^ 0x0001];
    pIter->iSwitchRowid = pIter->bRev ? SMALLEST_INT64 : LARGEST_INT64;
    for(i=(pIter->nSeg+iChanged)/2; 1; i=i/2){
      Fts5CResult *pRes = &pIter->aFirst[i];

      assert( pNew->pLeaf );
      assert( pRes->bTermEq==0 || pOther->pLeaf );

      if( pRes->bTermEq ){
        if( pNew->iRowid==pOther->iRowid ){
          return 1;
        }else if( (pOther->iRowid>pNew->iRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }else if( (pOther->iRowid>pIter->iSwitchRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pRes->iFirst = (u16)(pNew - pIter->aSeg);
      if( i==1 ) break;

      pOther = &pIter->aSeg[ pIter->aFirst[i ^ 0x0001].iFirst ];
    }
  }

  *ppFirst = pNew;
  return 0;
}